

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derEnc(octet *der,u32 tag,void *val,size_t len)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar1 = derTEnc((octet *)0x0,tag);
  sVar3 = 0xffffffffffffffff;
  if ((sVar1 != 0xffffffffffffffff) &&
     (sVar2 = derLEnc((octet *)0x0,len), sVar2 != 0xffffffffffffffff)) {
    if (der != (octet *)0x0) {
      memMove(der + sVar1 + sVar2,val,len);
      sVar3 = derTEnc(der,tag);
      if (sVar3 != sVar1) {
        return 0xffffffffffffffff;
      }
      sVar3 = derLEnc(der + sVar1,len);
      if (sVar3 != sVar2) {
        return 0xffffffffffffffff;
      }
    }
    sVar3 = sVar1 + len + sVar2;
  }
  return sVar3;
}

Assistant:

size_t derEnc(octet der[], u32 tag, const void* val, size_t len)
{
	size_t t_count;
	size_t l_count;
	// t_count <- len(T)
	t_count = derTEnc(0, tag);
	if (t_count == SIZE_MAX)
		return SIZE_MAX;
	// l_count <- len(L)
	l_count = derLEnc(0, len);
	if (l_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать?
	if (der)
	{
		ASSERT(memIsValid(val, len));
		ASSERT(memIsValid(der, t_count + l_count + len));
		// der <- TLV
		memMove(der + t_count + l_count, val, len);
		if (derTEnc(der, tag) != t_count ||
			derLEnc(der + t_count, len) != l_count)
			return SIZE_MAX;
	}
	return t_count + l_count + len;
}